

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O0

void Psr_ManRemapOne(Vec_Int_t *vSigs,Psr_Ntk_t *pNtkBox,Vec_Int_t *vMap)

{
  int iVar1;
  bool bVar2;
  int local_28;
  int local_24;
  int NameId;
  int i;
  Vec_Int_t *vMap_local;
  Psr_Ntk_t *pNtkBox_local;
  Vec_Int_t *vSigs_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Psr_NtkPiNum(pNtkBox);
    bVar2 = false;
    if (local_24 < iVar1) {
      local_28 = Vec_IntEntry(&pNtkBox->vInputs,local_24);
      bVar2 = local_28 != 0;
    }
    if (!bVar2) break;
    iVar1 = Vec_IntEntry(vMap,local_28);
    if (iVar1 != -1) {
      __assert_fail("Vec_IntEntry(vMap, NameId) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrsBuild.c"
                    ,0x65,"void Psr_ManRemapOne(Vec_Int_t *, Psr_Ntk_t *, Vec_Int_t *)");
    }
    Vec_IntWriteEntry(vMap,local_28,local_24 + 1);
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Psr_NtkPoNum(pNtkBox);
    bVar2 = false;
    if (local_24 < iVar1) {
      local_28 = Vec_IntEntry(&pNtkBox->vOutputs,local_24);
      bVar2 = local_28 != 0;
    }
    if (!bVar2) break;
    iVar1 = Vec_IntEntry(vMap,local_28);
    if (iVar1 != -1) {
      __assert_fail("Vec_IntEntry(vMap, NameId) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrsBuild.c"
                    ,0x6a,"void Psr_ManRemapOne(Vec_Int_t *, Psr_Ntk_t *, Vec_Int_t *)");
    }
    iVar1 = Psr_NtkPiNum(pNtkBox);
    Vec_IntWriteEntry(vMap,local_28,iVar1 + local_24 + 1);
    local_24 = local_24 + 1;
  }
  iVar1 = Vec_IntSize(vSigs);
  if (iVar1 % 2 != 0) {
    __assert_fail("Vec_IntSize(vSigs) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrsBuild.c"
                  ,0x6e,"void Psr_ManRemapOne(Vec_Int_t *, Psr_Ntk_t *, Vec_Int_t *)");
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vSigs);
    if (iVar1 <= local_24) {
      local_24 = 0;
      while( true ) {
        iVar1 = Psr_NtkPiNum(pNtkBox);
        bVar2 = false;
        if (local_24 < iVar1) {
          local_28 = Vec_IntEntry(&pNtkBox->vInputs,local_24);
          bVar2 = local_28 != 0;
        }
        if (!bVar2) break;
        Vec_IntWriteEntry(vMap,local_28,-1);
        local_24 = local_24 + 1;
      }
      local_24 = 0;
      while( true ) {
        iVar1 = Psr_NtkPoNum(pNtkBox);
        bVar2 = false;
        if (local_24 < iVar1) {
          local_28 = Vec_IntEntry(&pNtkBox->vOutputs,local_24);
          bVar2 = local_28 != 0;
        }
        if (!bVar2) break;
        Vec_IntWriteEntry(vMap,local_28,-1);
        local_24 = local_24 + 1;
      }
      return;
    }
    local_28 = Vec_IntEntry(vSigs,local_24);
    iVar1 = Vec_IntEntry(vMap,local_28);
    if (iVar1 == -1) break;
    iVar1 = Vec_IntEntry(vMap,local_28);
    Vec_IntWriteEntry(vSigs,local_24,iVar1);
    local_24 = local_24 + 2;
  }
  __assert_fail("Vec_IntEntry(vMap, NameId) != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrsBuild.c"
                ,0x71,"void Psr_ManRemapOne(Vec_Int_t *, Psr_Ntk_t *, Vec_Int_t *)");
}

Assistant:

void Psr_ManRemapOne( Vec_Int_t * vSigs, Psr_Ntk_t * pNtkBox, Vec_Int_t * vMap )
{
    int i, NameId;
    // map formal names into I/O indexes
    Psr_NtkForEachPi( pNtkBox, NameId, i )
    {
        assert( Vec_IntEntry(vMap, NameId) == -1 );
        Vec_IntWriteEntry( vMap, NameId, i + 1 ); // +1 to keep 1st form input non-zero
    }
    Psr_NtkForEachPo( pNtkBox, NameId, i )
    {
        assert( Vec_IntEntry(vMap, NameId) == -1 );
        Vec_IntWriteEntry( vMap, NameId, Psr_NtkPiNum(pNtkBox) + i + 1 ); // +1 to keep 1st form input non-zero
    }
    // remap box
    assert( Vec_IntSize(vSigs) % 2 == 0 );
    Vec_IntForEachEntry( vSigs, NameId, i )
    {
        assert( Vec_IntEntry(vMap, NameId) != -1 );
        Vec_IntWriteEntry( vSigs, i++, Vec_IntEntry(vMap, NameId) );
    }
    // unmap formal inputs
    Psr_NtkForEachPi( pNtkBox, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
    Psr_NtkForEachPo( pNtkBox, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
}